

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyTableValue::IfcPropertyTableValue(IfcPropertyTableValue *this)

{
  *(undefined ***)&this->field_0x100 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x108 = 0;
  *(char **)&this->field_0x110 = "IfcPropertyTableValue";
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__00878510);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x878480;
  *(undefined8 *)&this->field_0x100 = 0x8784f8;
  *(undefined8 *)&this->field_0x58 = 0x8784a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>)._vptr_ObjectHelper
       = (_func_int **)0x8784d0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyTableValue,_5UL>).field_0x20 = 0;
  (this->DefinedValues).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DefinedValues).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DefinedValues).
  super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  .
  super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Expression).ptr._M_dataplus._M_p = (pointer)&(this->Expression).ptr.field_2;
  (this->Expression).ptr._M_string_length = 0;
  (this->Expression).ptr.field_2._M_local_buf[0] = '\0';
  (this->Expression).have = false;
  (this->DefiningUnit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->DefiningUnit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->DefiningUnit).have = false;
  (this->DefinedUnit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->DefinedUnit).ptr.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->DefinedUnit).have = false;
  return;
}

Assistant:

IfcPropertyTableValue() : Object("IfcPropertyTableValue") {}